

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.hpp
# Opt level: O0

void mraa::Iio::private_event_handler(iio_event_data *data,void *args)

{
  int local_58;
  int local_54;
  int different;
  int channel2;
  int channel;
  int direction;
  int type;
  int modifier;
  int chan_type;
  IioEventData eventData;
  IioHandler *handler;
  void *args_local;
  iio_event_data *data_local;
  
  if (args != (void *)0x0) {
    eventData._20_8_ = args;
    mraa_iio_event_extract_event
              (data,&type,&direction,&channel,&channel2,&different,&local_54,&local_58);
    modifier = type;
    chan_type = direction;
    eventData.channelType = channel;
    eventData.modifier = channel2;
    eventData.type = different;
    eventData.direction = local_54;
    eventData.channel = local_58;
    (*(code *)**(undefined8 **)eventData._20_8_)(eventData._20_8_,&modifier);
  }
  return;
}

Assistant:

static void
    private_event_handler(iio_event_data* data, void* args)
    {
        if (args != NULL) {
            IioHandler* handler = (IioHandler*) args;
            IioEventData eventData;
            int chan_type, modifier, type, direction, channel, channel2, different;
            mraa_iio_event_extract_event(data, &chan_type, &modifier, &type, &direction, &channel,
                                         &channel2, &different);
            eventData.channelType = chan_type;
            eventData.modifier = modifier;
            eventData.type = type;
            eventData.direction = direction;
            eventData.channel = channel;
            eventData.channel2 = channel2;
            eventData.diff = different;
            handler->onIioEvent(eventData);
        }
    }